

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

void * spng_get_png_buffer(spng_ctx *ctx,size_t *len,int *error)

{
  spng_state sVar1;
  bool bVar2;
  uint uVar3;
  
  bVar2 = len == (size_t *)0x0 || ctx == (spng_ctx *)0x0;
  uVar3 = (uint)bVar2;
  if (error != (int *)0x0) {
    *error = (uint)bVar2;
    uVar3 = 0;
  }
  if (len != (size_t *)0x0 && ctx != (spng_ctx *)0x0) {
    if ((*(ushort *)&ctx->field_0xcc & 0x10) == 0) {
      if (error != (int *)0x0) {
        *error = 0x51;
      }
    }
    else {
      sVar1 = ctx->state;
      if (sVar1 == SPNG_STATE_INVALID) {
        if (error != (int *)0x0) {
          *error = 0x46;
        }
      }
      else if (((*(ushort *)&ctx->field_0xcc & 2) == 0) || (sVar1 < SPNG_STATE_EOI)) {
        if (error != (int *)0x0) {
          *error = 0x54;
        }
      }
      else if (sVar1 == SPNG_STATE_IEND) {
        if (error != (int *)0x0) {
          uVar3 = *error;
        }
        if (uVar3 == 0) {
          ctx->user_owns_out_png = 1;
          *len = ctx->bytes_encoded;
          return ctx->out_png;
        }
      }
      else if (error != (int *)0x0) {
        *error = 0x55;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *spng_get_png_buffer(spng_ctx *ctx, size_t *len, int *error)
{
    int tmp = 0;
    error = error ? error : &tmp;
    *error = 0;

    if(ctx == NULL || !len) *error = SPNG_EINVAL;

    if(*error) return NULL;

    if(!ctx->encode_only) *error = SPNG_ECTXTYPE;
    else if(!ctx->state) *error = SPNG_EBADSTATE;
    else if(!ctx->internal_buffer) *error = SPNG_EOPSTATE;
    else if(ctx->state < SPNG_STATE_EOI) *error = SPNG_EOPSTATE;
    else if(ctx->state != SPNG_STATE_IEND) *error = SPNG_ENOTFINAL;

    if(*error) return NULL;

    ctx->user_owns_out_png = 1;

    *len = ctx->bytes_encoded;

    return ctx->out_png;
}